

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O0

int mod2dense_equal(mod2dense *m1,mod2dense *m2)

{
  uint uVar1;
  int *in_RSI;
  int *in_RDI;
  mod2word m;
  int w;
  int j;
  int k;
  int local_20;
  int local_1c;
  
  if ((*in_RDI == *in_RSI) && (in_RDI[1] == in_RSI[1])) {
    uVar1 = (1 << ((char)*in_RDI + 0x20U & 0x1f)) - 1;
    local_20 = 0;
    while( true ) {
      if (in_RDI[1] <= local_20) {
        return 1;
      }
      for (local_1c = 0; local_1c < in_RDI[2] + -1; local_1c = local_1c + 1) {
        if (*(int *)(*(long *)(*(long *)(in_RDI + 4) + (long)local_20 * 8) + (long)local_1c * 4) !=
            *(int *)(*(long *)(*(long *)(in_RSI + 4) + (long)local_20 * 8) + (long)local_1c * 4)) {
          return 0;
        }
      }
      if ((*(uint *)(*(long *)(*(long *)(in_RDI + 4) + (long)local_20 * 8) + (long)local_1c * 4) &
          uVar1) != (*(uint *)(*(long *)(*(long *)(in_RSI + 4) + (long)local_20 * 8) +
                              (long)local_1c * 4) & uVar1)) break;
      local_20 = local_20 + 1;
    }
    return 0;
  }
  fprintf(_stderr,"mod2dense_equal: Matrices have different dimensions\n");
  exit(1);
}

Assistant:

int mod2dense_equal
( mod2dense *m1,
  mod2dense *m2
)
{
  int k, j, w;
  mod2word m;

  if (mod2dense_rows(m1)!=mod2dense_rows(m2) 
   || mod2dense_cols(m1)!=mod2dense_cols(m2))
  { fprintf(stderr,"mod2dense_equal: Matrices have different dimensions\n");
    exit(1);
  }

  w = m1->n_words;

  /* Form a mask that has 1s in the lower bit positions corresponding to
     bits that contain information in the last word of a matrix column. */

  m = (1 << (mod2_wordsize - (w*mod2_wordsize-m1->n_rows))) - 1;
  
  for (j = 0; j<mod2dense_cols(m1); j++)
  {
    for (k = 0; k<w-1; k++)
    { if (m1->col[j][k] != m2->col[j][k]) return 0;
    }

    if ((m1->col[j][k]&m) != (m2->col[j][k]&m)) return 0;
  }

  return 1;
}